

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.h
# Opt level: O0

void __thiscall
Js::DynamicTypeHandler::SetHasOnlyWritableDataProperties(DynamicTypeHandler *this,bool value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool value_local;
  DynamicTypeHandler *this_local;
  
  bVar2 = GetHasOnlyWritableDataProperties(this);
  if (value != bVar2) {
    this->propertyTypes = this->propertyTypes ^ 0x10;
  }
  this->propertyTypes = this->propertyTypes | 0x20;
  if ((this->propertyTypes & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                ,0x1a1,"((propertyTypes & 0x01) != 0)",
                                "(propertyTypes & PropertyTypesReserved) != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void SetHasOnlyWritableDataProperties(bool value)
        {
            if (value != GetHasOnlyWritableDataProperties())
            {
                propertyTypes ^= PropertyTypesWritableDataOnly;
            }

            // Turn on the detection bit.
            propertyTypes |= PropertyTypesWritableDataOnlyDetection;
            Assert((propertyTypes & PropertyTypesReserved) != 0);
        }